

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall sglr::rc::Texture2D::updateView(Texture2D *this,DepthStencilMode mode)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  ConstPixelBufferAccess *pCVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  
  uVar6 = (this->super_Texture).m_baseLevel;
  uVar7 = (ulong)uVar6;
  if ((uVar7 < 0xe) && ((this->m_levels).m_data[uVar7].m_cap != 0)) {
    bVar3 = isEmpty(&(this->m_levels).m_access[uVar7].super_ConstPixelBufferAccess);
    if (!bVar3) {
      if ((this->super_Texture).m_sampler.minFilter < NEAREST_MIPMAP_NEAREST) {
        iVar8 = 1;
      }
      else {
        uVar1 = (this->m_levels).m_access[uVar7].super_ConstPixelBufferAccess.m_size.m_data[0];
        uVar2 = (this->m_levels).m_access[uVar7].super_ConstPixelBufferAccess.m_size.m_data[1];
        iVar4 = ((this->super_Texture).m_maxLevel - uVar6) + 1;
        if ((int)uVar2 < (int)uVar1) {
          uVar2 = uVar1;
        }
        uVar6 = 0x20;
        if (uVar2 != 0) {
          uVar6 = 0x1f;
          if (uVar2 != 0) {
            for (; uVar2 >> uVar6 == 0; uVar6 = uVar6 - 1) {
            }
          }
          uVar6 = uVar6 ^ 0x1f;
        }
        iVar8 = 0x20 - uVar6;
        if (iVar4 < (int)(0x20 - uVar6)) {
          iVar8 = iVar4;
        }
      }
      TextureLevelArray::updateSamplerMode(&this->m_levels,mode);
      pCVar5 = (this->m_levels).m_effectiveAccess + uVar7;
      goto LAB_00883110;
    }
  }
  iVar8 = 0;
  pCVar5 = (ConstPixelBufferAccess *)0x0;
LAB_00883110:
  (this->m_view).m_numLevels = iVar8;
  (this->m_view).m_levels = pCVar5;
  return;
}

Assistant:

void Texture2D::updateView (tcu::Sampler::DepthStencilMode mode)
{
	const int baseLevel	= getBaseLevel();

	if (hasLevel(baseLevel) && !isEmpty(getLevel(baseLevel)))
	{
		// Update number of levels in mipmap pyramid.
		const int	width		= getLevel(baseLevel).getWidth();
		const int	height		= getLevel(baseLevel).getHeight();
		const bool	isMipmap	= isMipmapFilter(getSampler().minFilter);
		const int	numLevels	= isMipmap ? de::min(getMaxLevel()-baseLevel+1, getNumMipLevels2D(width, height)) : 1;

		m_levels.updateSamplerMode(mode);
		m_view = tcu::Texture2DView(numLevels, m_levels.getEffectiveLevels() + baseLevel);
	}
	else
		m_view = tcu::Texture2DView(0, DE_NULL);
}